

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall FIX::FieldBase::swap(FieldBase *this,FieldBase *rhs)

{
  FieldBase *rhs_local;
  FieldBase *this_local;
  
  std::swap<int>(&this->m_tag,&rhs->m_tag);
  std::swap<FIX::FieldBase::field_metrics>(&this->m_metrics,&rhs->m_metrics);
  std::__cxx11::string::swap((string *)&this->m_string);
  std::__cxx11::string::swap((string *)&this->m_data);
  return;
}

Assistant:

void swap(FieldBase &rhs) {
    std::swap(m_tag, rhs.m_tag);
    std::swap(m_metrics, rhs.m_metrics);
    m_string.swap(rhs.m_string);
    m_data.swap(rhs.m_data);
  }